

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.cpp
# Opt level: O2

PointType __thiscall
CubicInterpolation::at(CubicInterpolation *this,double *t,int *derivative_order)

{
  undefined4 *in_RCX;
  long lVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double in_XMM1_Qa;
  PointType PVar3;
  double tpow;
  double local_2b0;
  double local_2a8;
  undefined1 local_2a0 [32];
  scalar_constant_op<double> local_280;
  scalar_constant_op<double> local_268;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_238;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_210;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_1c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_180;
  undefined1 local_158 [32];
  RhsNested local_138;
  scalar_constant_op<double> local_110;
  RhsNested local_108;
  double local_f0;
  undefined1 local_88 [40];
  RhsNested local_60;
  double local_48;
  
  switch(*in_RCX) {
  case 0:
    dVar2 = 0.0;
    (this->super_Curve<3,_2>)._vptr_Curve = (_func_int **)0x0;
    (this->super_Curve<3,_2>).length_ = 0.0;
    local_2a0._0_8_ = 1.0;
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
      Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_158,
                 (MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)((long)t + lVar1 + 0x10),
                 (double *)local_2a0);
      Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)this,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                  *)local_158);
      dVar2 = *(double *)derivative_order * (double)local_2a0._0_8_;
      local_2a0._0_8_ = dVar2;
    }
    break;
  case 1:
    local_2a8 = 2.0;
    Eigen::operator*(&local_238,&local_2a8,(StorageBaseType *)(t + 6));
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
    ::operator*(&local_1c8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
                 *)&local_238,(double *)derivative_order);
    local_88._32_8_ = local_1c8.m_lhs.m_lhs.m_functor.m_other;
    local_60 = local_1c8.m_lhs.m_rhs;
    local_48 = local_1c8.m_rhs.m_functor.m_other;
    local_2b0 = 3.0;
    local_88._0_8_ = t + 4;
    Eigen::operator*(&local_180,&local_2b0,(StorageBaseType *)(t + 8));
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
    ::operator*(&local_210,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
                 *)&local_180,(double *)derivative_order);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                 *)local_2a0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
                 *)&local_210,(double *)derivative_order);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                 *)local_158,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
                 *)local_88,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                 *)local_2a0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)this,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                *)local_158);
    dVar2 = extraout_XMM0_Qa_01;
    break;
  case 2:
    local_210._0_8_ = 0x4000000000000000;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                      *)local_88,(double *)&local_210,(StorageBaseType *)(t + 6));
    local_238._0_8_ = 0x4018000000000000;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                      *)&local_1c8,(double *)&local_238,(StorageBaseType *)(t + 8));
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                 *)local_2a0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
                 *)&local_1c8,(double *)derivative_order);
    local_158._24_8_ = local_88._16_8_;
    local_138 = (RhsNested)local_88._24_8_;
    local_110.m_other = (double)local_2a0._24_8_;
    local_108 = (RhsNested)local_280.m_other;
    local_f0 = local_268.m_other;
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)this,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                *)local_158);
    dVar2 = extraout_XMM0_Qa;
    break;
  case 3:
    local_2a0._0_8_ = 6.0;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                      *)local_158,(double *)local_2a0,(StorageBaseType *)(t + 8));
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)this,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)local_158);
    dVar2 = extraout_XMM0_Qa_00;
    break;
  default:
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)this,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)local_158);
    dVar2 = extraout_XMM0_Qa_02;
  }
  PVar3.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  PVar3.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       dVar2;
  return (PointType)
         PVar3.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

auto CubicInterpolation::at(const double& t, const int& derivative_order) const
    -> CubicInterpolation::PointType {
  switch (derivative_order) {
    case 0: {
      PointType point(0.0, 0.0);
      double tpow = 1.0;
      for (const auto& coeff : coeffs_) {
        point += coeff * tpow;
        tpow *= t;
      }
      return point;
    }
    case 1:
      return coeffs_[1] + 2.0 * coeffs_[2] * t + 3.0 * coeffs_[3] * t * t;
    case 2:
      return 2.0 * coeffs_[2] + 6.0 * coeffs_[3] * t;
    case 3:
      return 6.0 * coeffs_[3];
    default:
      return PointType::Zero();
  }
}